

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall Loop::EnsureMemOpVariablesInitialized(Loop *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Func *pFVar4;
  JitArenaAllocator *pJVar5;
  MemOpInfo *pMVar6;
  BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  SListCounted<Loop::MemOpCandidate_*,_Memory::ArenaAllocator> *this_02;
  TrackAllocData local_e8;
  code *local_c0;
  undefined8 local_b8;
  TrackAllocData local_b0;
  code *local_88;
  undefined8 local_80;
  TrackAllocData local_78;
  code *local_50;
  undefined8 local_48;
  TrackAllocData local_40;
  JitArenaAllocator *local_18;
  JitArenaAllocator *allocator;
  Loop *this_local;
  
  allocator = (JitArenaAllocator *)this;
  if ((*(ushort *)&this->field_0x178 >> 10 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x53c,"(this->doMemOp)","this->doMemOp");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->memOpInfo == (MemOpInfo *)0x0) {
    pFVar4 = GetFunc(this);
    pFVar4 = Func::GetTopFunc(pFVar4);
    pJVar5 = pFVar4->m_fg->alloc;
    local_18 = pJVar5;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&MemOpInfo::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
               ,0x540);
    pJVar5 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar5,&local_40);
    local_50 = Memory::JitArenaAllocator::Alloc;
    local_48 = 0;
    pMVar6 = (MemOpInfo *)new<Memory::JitArenaAllocator>(0x48,pJVar5,0x4e98c0);
    pJVar5 = local_18;
    this->memOpInfo = pMVar6;
    this->memOpInfo->inductionVariablesUsedAfterLoop = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    this->memOpInfo->startIndexOpndCache[0] = (RegOpnd *)0x0;
    this->memOpInfo->startIndexOpndCache[1] = (RegOpnd *)0x0;
    this->memOpInfo->startIndexOpndCache[2] = (RegOpnd *)0x0;
    this->memOpInfo->startIndexOpndCache[3] = (RegOpnd *)0x0;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_78,
               (type_info *)
               &JsUtil::
                BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
               ,0x546);
    pJVar5 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar5,&local_78);
    local_88 = Memory::JitArenaAllocator::Alloc;
    local_80 = 0;
    this_00 = (BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::JitArenaAllocator>(0x38,pJVar5,0x4e98c0);
    JsUtil::
    BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_00,local_18,0);
    pJVar5 = local_18;
    this->memOpInfo->inductionVariableChangeInfoMap = this_00;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_b0,
               (type_info *)
               &JsUtil::
                BaseDictionary<unsigned_char,IR::Opnd*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
               ,0x547);
    pJVar5 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar5,&local_b0);
    local_c0 = Memory::JitArenaAllocator::Alloc;
    local_b8 = 0;
    this_01 = (BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::JitArenaAllocator>(0x38,pJVar5,0x4e98c0);
    JsUtil::
    BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_01,local_18,0);
    pJVar5 = local_18;
    this->memOpInfo->inductionVariableOpndPerUnrollMap = this_01;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_e8,
               (type_info *)&SListCounted<Loop::MemOpCandidate*,Memory::ArenaAllocator>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
               ,0x548);
    pJVar5 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar5,&local_e8);
    this_02 = (SListCounted<Loop::MemOpCandidate_*,_Memory::ArenaAllocator> *)
              new<Memory::JitArenaAllocator>(0x18,pJVar5,0x4e98c0);
    SListCounted<Loop::MemOpCandidate_*,_Memory::ArenaAllocator>::SListCounted
              (this_02,&local_18->super_ArenaAllocator);
    this->memOpInfo->candidates = this_02;
  }
  return;
}

Assistant:

void
Loop::EnsureMemOpVariablesInitialized()
{
    Assert(this->doMemOp);
    if (this->memOpInfo == nullptr)
    {
        JitArenaAllocator *allocator = this->GetFunc()->GetTopFunc()->m_fg->alloc;
        this->memOpInfo = JitAnewStruct(allocator, Loop::MemOpInfo);
        this->memOpInfo->inductionVariablesUsedAfterLoop = nullptr;
        this->memOpInfo->startIndexOpndCache[0] = nullptr;
        this->memOpInfo->startIndexOpndCache[1] = nullptr;
        this->memOpInfo->startIndexOpndCache[2] = nullptr;
        this->memOpInfo->startIndexOpndCache[3] = nullptr;
        this->memOpInfo->inductionVariableChangeInfoMap = JitAnew(allocator, Loop::InductionVariableChangeInfoMap, allocator);
        this->memOpInfo->inductionVariableOpndPerUnrollMap = JitAnew(allocator, Loop::InductionVariableOpndPerUnrollMap, allocator);
        this->memOpInfo->candidates = JitAnew(allocator, Loop::MemOpList, allocator);
    }
}